

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O0

iter_type __thiscall
booster::locale::impl_icu::num_parse<char>::do_real_get<long>
          (num_parse<char> *this,iter_type in,iter_type end,ios_base *ios,iostate *err,long *val)

{
  bool bVar1;
  char_type cVar2;
  int iVar3;
  pointer pfVar4;
  ulong uVar5;
  undefined4 extraout_var;
  undefined8 in_RCX;
  undefined4 in_EDX;
  undefined8 in_RSI;
  num_parse<char> *in_RDI;
  undefined4 in_R8D;
  long in_R9;
  bool bVar6;
  istreambuf_iterator<char,_std::char_traits<char>_> iVar7;
  iter_type iVar8;
  undefined8 in_stack_00000008;
  istreambuf_iterator<char,_std::char_traits<char>_> *in_stack_00000010;
  size_t n;
  size_t parsed_chars;
  cast_type value;
  char c;
  string_type tmp;
  stream_type *stream_ptr;
  formatter_ptr formatter;
  string *in_stack_fffffffffffffe58;
  istreambuf_iterator<char,_std::char_traits<char>_> *in_stack_fffffffffffffe60;
  undefined7 in_stack_fffffffffffffe68;
  undefined1 in_stack_fffffffffffffe6f;
  istreambuf_iterator<char,_std::char_traits<char>_> *in_stack_fffffffffffffe70;
  istreambuf_iterator<char,_std::char_traits<char>_> *local_138;
  undefined8 local_120;
  undefined4 local_118;
  ulong local_110;
  streambuf_type *local_100;
  streambuf_type *local_f8;
  int_type local_f0;
  streambuf_type *local_e8;
  int_type local_e0;
  char_type local_d1;
  string local_d0 [36];
  undefined4 local_ac;
  undefined1 local_a8 [12];
  undefined4 local_98;
  undefined4 uStack_94;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  undefined8 local_88;
  byte local_69;
  istreambuf_iterator<char,_std::char_traits<char>_> *local_50;
  long local_40;
  undefined8 local_30;
  undefined4 uStack_28;
  undefined4 uStack_24;
  undefined8 local_20;
  undefined4 uStack_18;
  undefined1 local_10 [12];
  
  local_40 = in_R9;
  local_30 = in_RCX;
  uStack_28 = in_R8D;
  local_20 = in_RSI;
  uStack_18 = in_EDX;
  std::
  unique_ptr<booster::locale::impl_icu::formatter<char>,std::default_delete<booster::locale::impl_icu::formatter<char>>>
  ::unique_ptr<std::default_delete<booster::locale::impl_icu::formatter<char>>,void>
            ((unique_ptr<booster::locale::impl_icu::formatter<char>,_std::default_delete<booster::locale::impl_icu::formatter<char>_>_>
              *)in_stack_fffffffffffffe60);
  if (local_40 == 0) {
    local_138 = (istreambuf_iterator<char,_std::char_traits<char>_> *)0x0;
  }
  else {
    local_138 = (istreambuf_iterator<char,_std::char_traits<char>_> *)
                __dynamic_cast(local_40,&std::ios_base::typeinfo,&std::istream::typeinfo,
                               0xffffffffffffffff);
  }
  local_50 = local_138;
  local_69 = 0;
  bVar6 = true;
  if (local_138 != (istreambuf_iterator<char,_std::char_traits<char>_> *)0x0) {
    bVar1 = num_base::use_parent<long>
                      ((ios_base *)CONCAT17(in_stack_fffffffffffffe6f,in_stack_fffffffffffffe68),
                       (long)in_stack_fffffffffffffe60);
    bVar6 = true;
    if (!bVar1) {
      formatter<char>::create
                ((ios_base *)CONCAT17(in_stack_fffffffffffffe6f,in_stack_fffffffffffffe68),
                 (Locale *)in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
      local_69 = 1;
      std::
      unique_ptr<booster::locale::impl_icu::formatter<char>,_std::default_delete<booster::locale::impl_icu::formatter<char>_>_>
      ::operator=((unique_ptr<booster::locale::impl_icu::formatter<char>,_std::default_delete<booster::locale::impl_icu::formatter<char>_>_>
                   *)in_stack_fffffffffffffe60,
                  (unique_ptr<booster::locale::impl_icu::formatter<char>,_std::default_delete<booster::locale::impl_icu::formatter<char>_>_>
                   *)in_stack_fffffffffffffe58);
      pfVar4 = std::
               unique_ptr<booster::locale::impl_icu::formatter<char>,_std::default_delete<booster::locale::impl_icu::formatter<char>_>_>
               ::get((unique_ptr<booster::locale::impl_icu::formatter<char>,_std::default_delete<booster::locale::impl_icu::formatter<char>_>_>
                      *)in_stack_fffffffffffffe60);
      bVar6 = pfVar4 == (pointer)0x0;
    }
  }
  if ((local_69 & 1) != 0) {
    std::
    unique_ptr<booster::locale::impl_icu::formatter<char>,_std::default_delete<booster::locale::impl_icu::formatter<char>_>_>
    ::~unique_ptr((unique_ptr<booster::locale::impl_icu::formatter<char>,_std::default_delete<booster::locale::impl_icu::formatter<char>_>_>
                   *)in_stack_fffffffffffffe60);
  }
  if (bVar6) {
    local_88 = local_20;
    local_98 = (undefined4)local_30;
    uStack_94 = local_30._4_4_;
    uStack_90 = uStack_28;
    uStack_8c = uStack_24;
    local_a8 = std::num_get<char,std::istreambuf_iterator<char,std::char_traits<char>>>::do_get
                         (in_RDI,local_20,uStack_18,local_30,uStack_28,local_40,in_stack_00000008);
    local_ac = 1;
    local_10 = local_a8;
  }
  else {
    std::__cxx11::string::string(local_d0);
    std::__cxx11::string::reserve((ulong)local_d0);
    while( true ) {
      bVar1 = std::operator!=(in_stack_fffffffffffffe60,
                              (istreambuf_iterator<char,_std::char_traits<char>_> *)
                              in_stack_fffffffffffffe58);
      bVar6 = false;
      if ((bVar1) &&
         ((local_d1 = std::istreambuf_iterator<char,_std::char_traits<char>_>::operator*
                                (in_stack_fffffffffffffe60), ' ' < local_d1 ||
          (bVar6 = true, local_d1 < '\x01')))) {
        bVar6 = local_d1 == '\x7f';
      }
      if (!bVar6) break;
      std::istreambuf_iterator<char,_std::char_traits<char>_>::operator++(in_stack_fffffffffffffe60)
      ;
    }
    while( true ) {
      uVar5 = std::__cxx11::string::size();
      bVar6 = false;
      if (uVar5 < 0x1000) {
        bVar1 = std::operator!=(in_stack_fffffffffffffe60,
                                (istreambuf_iterator<char,_std::char_traits<char>_> *)
                                in_stack_fffffffffffffe58);
        bVar6 = false;
        if (bVar1) {
          cVar2 = std::istreambuf_iterator<char,_std::char_traits<char>_>::operator*
                            (in_stack_fffffffffffffe60);
          bVar6 = cVar2 != '\n';
        }
      }
      if (!bVar6) break;
      iVar7 = std::istreambuf_iterator<char,_std::char_traits<char>_>::operator++
                        ((istreambuf_iterator<char,_std::char_traits<char>_> *)
                         CONCAT17(in_stack_fffffffffffffe6f,in_stack_fffffffffffffe68),
                         (int)((ulong)in_stack_fffffffffffffe60 >> 0x20));
      local_f8 = iVar7._M_sbuf;
      local_f0 = iVar7._M_c;
      local_e8 = local_f8;
      local_e0 = local_f0;
      cVar2 = std::istreambuf_iterator<char,_std::char_traits<char>_>::operator*
                        (in_stack_fffffffffffffe60);
      std::__cxx11::string::operator+=(local_d0,cVar2);
    }
    pfVar4 = std::
             unique_ptr<booster::locale::impl_icu::formatter<char>,_std::default_delete<booster::locale::impl_icu::formatter<char>_>_>
             ::operator->((unique_ptr<booster::locale::impl_icu::formatter<char>,_std::default_delete<booster::locale::impl_icu::formatter<char>_>_>
                           *)0x279308);
    iVar3 = (*(pfVar4->super_base_formatter)._vptr_base_formatter[6])(pfVar4,local_d0,&local_100);
    if ((CONCAT44(extraout_var,iVar3) == 0) ||
       (bVar6 = valid<long,long>(in_RDI,(long)local_100), !bVar6)) {
      std::operator|=((_Ios_Iostate *)in_stack_fffffffffffffe60,
                      (_Ios_Iostate)((ulong)in_stack_fffffffffffffe58 >> 0x20));
    }
    else {
      in_stack_00000010->_M_sbuf = local_100;
    }
    for (local_110 = std::__cxx11::string::size(); CONCAT44(extraout_var,iVar3) < local_110;
        local_110 = local_110 - 1) {
      in_stack_fffffffffffffe70 = local_50;
      std::__cxx11::string::operator[]((ulong)local_d0);
      std::istream::putback((char)in_stack_fffffffffffffe70);
    }
    std::istreambuf_iterator<char,_std::char_traits<char>_>::istreambuf_iterator
              (in_stack_fffffffffffffe70,
               (istream_type *)CONCAT17(in_stack_fffffffffffffe6f,in_stack_fffffffffffffe68));
    uStack_18 = local_118;
    local_20 = local_120;
    bVar6 = std::operator==(in_stack_fffffffffffffe60,
                            (istreambuf_iterator<char,_std::char_traits<char>_> *)
                            in_stack_fffffffffffffe58);
    if (bVar6) {
      std::operator|=((_Ios_Iostate *)in_stack_fffffffffffffe60,
                      (_Ios_Iostate)((ulong)in_stack_fffffffffffffe58 >> 0x20));
    }
    local_10._0_8_ = local_20;
    local_10._8_4_ = uStack_18;
    local_ac = 1;
    std::__cxx11::string::~string(local_d0);
    in_stack_00000010 = in_stack_fffffffffffffe60;
  }
  std::
  unique_ptr<booster::locale::impl_icu::formatter<char>,_std::default_delete<booster::locale::impl_icu::formatter<char>_>_>
  ::~unique_ptr((unique_ptr<booster::locale::impl_icu::formatter<char>,_std::default_delete<booster::locale::impl_icu::formatter<char>_>_>
                 *)in_stack_00000010);
  iVar8._12_4_ = 0;
  iVar8._M_sbuf = (streambuf_type *)local_10._0_8_;
  iVar8._M_c = local_10._8_4_;
  return iVar8;
}

Assistant:

iter_type do_real_get(iter_type in,iter_type end,std::ios_base &ios,std::ios_base::iostate &err,ValueType &val) const
    {
        formatter_ptr formatter;
        stream_type *stream_ptr = dynamic_cast<stream_type *>(&ios);

        if(!stream_ptr || use_parent<ValueType>(ios,0) || (formatter = formatter_type::create(ios,loc_,enc_)).get()==0) {
            return std::num_get<CharType>::do_get(in,end,ios,err,val);
        }

        typedef typename details::cast_traits<ValueType>::cast_type cast_type;
        string_type tmp;
        tmp.reserve(64);

        CharType c;
        while(in!=end && (((c=*in)<=32 && (c>0)) || c==127)) // Assuming that ASCII is a subset
            ++in;

        while(tmp.size() < 4096 && in!=end && *in!='\n') {
            tmp += *in++;
        }

        cast_type value;
        size_t parsed_chars;

        if((parsed_chars = formatter->parse(tmp,value))==0 || !valid<ValueType>(value)) {
            err |= std::ios_base::failbit;
        }
        else {
            val=static_cast<ValueType>(value);
        }

        for(size_t n=tmp.size();n>parsed_chars;n--) {
            stream_ptr->putback(tmp[n-1]);
        }

        in = iter_type(*stream_ptr);

        if(in==end)
            err |=std::ios_base::eofbit;
        return in;
    }